

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O2

CURLcode Curl_waitfds_add_ps(curl_waitfds *cwfds,easy_pollset *ps)

{
  ulong uVar1;
  ushort uVar2;
  short *psVar3;
  uint uVar4;
  uint uVar5;
  curl_waitfd *pcVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar4 = ps->num;
  uVar9 = 0;
  do {
    if (uVar9 == uVar4) {
      return CURLE_OK;
    }
    uVar2 = (ps->actions[uVar9] & 1) + (ps->actions[uVar9] & 2) * 2;
    if ((char)uVar2 != '\0') {
      uVar5 = cwfds->n;
      uVar10 = (ulong)uVar5;
      uVar8 = uVar10;
      if ((int)uVar5 < 0) {
LAB_00149601:
        if (cwfds->count <= uVar5) {
          return CURLE_OUT_OF_MEMORY;
        }
        pcVar6 = cwfds->wfds;
        pcVar6[uVar10].fd = ps->sockets[uVar9];
        pcVar6[uVar10].events = uVar2;
        cwfds->n = uVar5 + 1;
      }
      else {
        do {
          if ((long)uVar8 < 1) goto LAB_00149601;
          uVar1 = uVar8 - 1;
          lVar7 = uVar8 - 1;
          uVar8 = uVar1;
        } while (cwfds->wfds[lVar7].fd != ps->sockets[uVar9]);
        psVar3 = &cwfds->wfds[uVar1].events;
        *psVar3 = *psVar3 | uVar2;
      }
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

CURLcode Curl_waitfds_add_ps(struct curl_waitfds *cwfds,
                             struct easy_pollset *ps)
{
  size_t i;

  DEBUGASSERT(cwfds);
  DEBUGASSERT(ps);
  for(i = 0; i < ps->num; i++) {
    short events = 0;
    if(ps->actions[i] & CURL_POLL_IN)
      events |= CURL_WAIT_POLLIN;
    if(ps->actions[i] & CURL_POLL_OUT)
      events |= CURL_WAIT_POLLOUT;
    if(events) {
      if(cwfds_add_sock(cwfds, ps->sockets[i], events))
        return CURLE_OUT_OF_MEMORY;
    }
  }
  return CURLE_OK;
}